

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar2 = this->index_;
  uVar1 = sVar2 + 0x18;
  if (uVar1 < 0x32) {
    uVar4 = sVar2 - 1;
    if (uVar1 < 0x19) {
      uVar4 = uVar1;
    }
    if ((sVar2 + 0x17 < 0x32) && (uVar1 = sVar2 + 0xe, uVar1 < 0x32)) {
      uVar9 = sVar2 + 0x12;
      uVar6 = sVar2 - 0xb;
      if (uVar1 < 0x19) {
        uVar6 = uVar1;
      }
      if ((uVar9 < 0x32) && (uVar1 = sVar2 + 0x11, uVar1 < 0x32)) {
        uVar3 = this->state_[uVar4];
        uVar8 = sVar2 - 7;
        if (uVar9 < 0x19) {
          uVar8 = uVar9;
        }
        uVar5 = this->state_[uVar6] ^ this->state_[sVar2] ^ this->state_[uVar6] << 0xf;
        uVar9 = sVar2 - 8;
        if (uVar1 < 0x19) {
          uVar9 = uVar1;
        }
        uVar7 = this->state_[uVar8] ^ this->state_[uVar9] ^
                this->state_[uVar9] << 0xb ^ this->state_[uVar8] >> 10 ^ uVar5;
        this->state_[sVar2] = uVar7;
        uVar3 = (uVar7 << 0x1c | uVar5 >> 0x14 ^ uVar3 >> 0x10) ^ uVar3 ^ uVar5;
        this->state_[uVar4] = uVar3;
        this->index_ = uVar4;
        return uVar3;
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 25>::calc(T, std::false_type) [UIntType = unsigned long, r = 25, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }